

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_block_sizes.cpp
# Opt level: O0

void construct_dt_entry_2d
               (uint x_texels,uint y_texels,uint x_weights,uint y_weights,block_size_descriptor *bsd
               ,dt_init_working_buffers *wb,uint index)

{
  uint uVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  long in_R8;
  uint bits_2planes;
  uint bits_1plane;
  int i;
  int maxprec_2planes;
  int maxprec_1plane;
  decimation_info *di;
  bool try_2planes;
  uint weight_count;
  dt_init_working_buffers *in_stack_00000078;
  decimation_info *in_stack_00000080;
  uint in_stack_00000088;
  uint in_stack_0000008c;
  uint in_stack_00000090;
  uint in_stack_00000094;
  quant_method local_3c;
  quant_method local_38;
  quant_method quant_level;
  
  if (0x40 < (uint)(in_EDX * in_ECX)) {
    __assert_fail("weight_count <= BLOCK_MAX_WEIGHTS",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_block_sizes.cpp"
                  ,0x2ec,
                  "void construct_dt_entry_2d(unsigned int, unsigned int, unsigned int, unsigned int, block_size_descriptor &, dt_init_working_buffers &, unsigned int)"
                 );
  }
  lVar2 = in_R8 + 0x260 + (ulong)bits_1plane * 0x1fb80;
  init_decimation_info_2d
            (in_stack_00000094,in_stack_00000090,in_stack_0000008c,in_stack_00000088,
             in_stack_00000080,in_stack_00000078);
  quant_level = ~QUANT_2;
  local_38 = ~QUANT_2;
  for (local_3c = QUANT_2; (int)local_3c < 0xc; local_3c = local_3c + QUANT_3) {
    uVar1 = get_ise_sequence_bitcount((uint)lVar2,quant_level);
    if ((0x17 < uVar1) && (uVar1 < 0x61)) {
      quant_level = local_3c;
    }
    if ((((uint)(in_EDX * in_ECX * 2) < 0x41) &&
        (uVar1 = get_ise_sequence_bitcount((uint)lVar2,quant_level), 0x17 < uVar1)) &&
       (uVar1 < 0x61)) {
      local_38 = local_3c;
    }
  }
  if ((int)quant_level < 0 && (int)local_38 < 0) {
    __assert_fail("maxprec_1plane >= 0 || maxprec_2planes >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_block_sizes.cpp"
                  ,0x308,
                  "void construct_dt_entry_2d(unsigned int, unsigned int, unsigned int, unsigned int, block_size_descriptor &, dt_init_working_buffers &, unsigned int)"
                 );
  }
  *(char *)(in_R8 + 0x40 + (ulong)bits_1plane * 6) = (char)quant_level;
  *(char *)(in_R8 + (ulong)bits_1plane * 6 + 0x41) = (char)local_38;
  *(undefined2 *)(in_R8 + (ulong)bits_1plane * 6 + 0x42) = 0;
  *(undefined2 *)(in_R8 + (ulong)bits_1plane * 6 + 0x44) = 0;
  return;
}

Assistant:

static void construct_dt_entry_2d(
	unsigned int x_texels,
	unsigned int y_texels,
	unsigned int x_weights,
	unsigned int y_weights,
	block_size_descriptor& bsd,
	dt_init_working_buffers& wb,
	unsigned int index
) {
	unsigned int weight_count = x_weights * y_weights;
	assert(weight_count <= BLOCK_MAX_WEIGHTS);

	bool try_2planes = (2 * weight_count) <= BLOCK_MAX_WEIGHTS;

	decimation_info& di = bsd.decimation_tables[index];
	init_decimation_info_2d(x_texels, y_texels, x_weights, y_weights, di, wb);

	int maxprec_1plane = -1;
	int maxprec_2planes = -1;
	for (int i = 0; i < 12; i++)
	{
		unsigned int bits_1plane = get_ise_sequence_bitcount(weight_count, static_cast<quant_method>(i));
		if (bits_1plane >= BLOCK_MIN_WEIGHT_BITS && bits_1plane <= BLOCK_MAX_WEIGHT_BITS)
		{
			maxprec_1plane = i;
		}

		if (try_2planes)
		{
			unsigned int bits_2planes = get_ise_sequence_bitcount(2 * weight_count, static_cast<quant_method>(i));
			if (bits_2planes >= BLOCK_MIN_WEIGHT_BITS && bits_2planes <= BLOCK_MAX_WEIGHT_BITS)
			{
				maxprec_2planes = i;
			}
		}
	}

	// At least one of the two should be valid ...
	assert(maxprec_1plane >= 0 || maxprec_2planes >= 0);
	bsd.decimation_modes[index].maxprec_1plane = static_cast<int8_t>(maxprec_1plane);
	bsd.decimation_modes[index].maxprec_2planes = static_cast<int8_t>(maxprec_2planes);
	bsd.decimation_modes[index].refprec_1plane = 0;
	bsd.decimation_modes[index].refprec_2planes = 0;
}